

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O0

uint Gia_LutDelayTraceTCEdges(Gia_Man_t *p,int iObj,float tDelta)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  float fVar5;
  float fVar6;
  int local_140;
  int iFanin;
  int k;
  uint uResult;
  float *pDelays;
  float local_128;
  float tRequired;
  float pPinDelays [32];
  int pPinPerm [32];
  If_LibLut_t *pLutLib;
  float tDelta_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  pvVar1 = p->pLutLib;
  iFanin = 0;
  fVar5 = Gia_ObjTimeRequired(p,iObj);
  if (pvVar1 == (void *)0x0) {
    for (local_140 = 0; iVar2 = Gia_ObjLutSize(p,iObj), local_140 < iVar2; local_140 = local_140 + 1
        ) {
      piVar4 = Gia_ObjLutFanins(p,iObj);
      fVar6 = Gia_ObjTimeArrival(p,piVar4[local_140]);
      if (fVar5 < fVar6 + 1.0 + tDelta) {
        iFanin = 1 << ((byte)local_140 & 0x1f) | iFanin;
      }
    }
  }
  else if (*(int *)((long)pvVar1 + 0xc) == 0) {
    iVar2 = Gia_ObjLutSize(p,iObj);
    for (local_140 = 0; iVar3 = Gia_ObjLutSize(p,iObj), local_140 < iVar3; local_140 = local_140 + 1
        ) {
      piVar4 = Gia_ObjLutFanins(p,iObj);
      fVar6 = Gia_ObjTimeArrival(p,piVar4[local_140]);
      if (fVar5 < fVar6 + *(float *)((long)pvVar1 + (long)iVar2 * 0x84 + 0x94) + tDelta) {
        iFanin = 1 << ((byte)local_140 & 0x1f) | iFanin;
      }
    }
  }
  else {
    iVar2 = Gia_ObjLutSize(p,iObj);
    Gia_LutDelayTraceSortPins(p,iObj,(int *)(pPinDelays + 0x1e),&local_128);
    for (local_140 = 0; iVar3 = Gia_ObjLutSize(p,iObj), local_140 < iVar3; local_140 = local_140 + 1
        ) {
      Gia_ObjLutFanins(p,iObj);
      iVar3 = Gia_ObjLutFanin(p,iObj,(int)pPinDelays[(long)local_140 + 0x1e]);
      fVar6 = Gia_ObjTimeArrival(p,iVar3);
      if (fVar5 < fVar6 + *(float *)((long)pvVar1 + (long)local_140 * 4 + (long)iVar2 * 0x84 + 0x94)
                  + tDelta) {
        iFanin = 1 << (SUB41(pPinDelays[(long)local_140 + 0x1e],0) & 0x1f) | iFanin;
      }
    }
  }
  return iFanin;
}

Assistant:

unsigned Gia_LutDelayTraceTCEdges( Gia_Man_t * p, int iObj, float tDelta )
{
    If_LibLut_t * pLutLib = (If_LibLut_t *)p->pLutLib;
    int pPinPerm[32];
    float pPinDelays[32];
    float tRequired, * pDelays;
    unsigned uResult = 0;
    int k, iFanin;
    tRequired = Gia_ObjTimeRequired( p, iObj );
    if ( pLutLib == NULL )
    {
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( tRequired < Gia_ObjTimeArrival(p, iFanin) + 1.0 + tDelta )
                uResult |= (1 << k);
    }
    else if ( !pLutLib->fVarPinDelays )
    {
        pDelays = pLutLib->pLutDelays[Gia_ObjLutSize(p, iObj)];
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( tRequired < Gia_ObjTimeArrival(p, iFanin) + pDelays[0] + tDelta )
                uResult |= (1 << k);
    }
    else
    {
        pDelays = pLutLib->pLutDelays[Gia_ObjLutSize(p, iObj)];
        Gia_LutDelayTraceSortPins( p, iObj, pPinPerm, pPinDelays );
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( tRequired < Gia_ObjTimeArrival( p, Gia_ObjLutFanin(p, iObj,pPinPerm[k])) + pDelays[k] + tDelta )
                uResult |= (1 << pPinPerm[k]);
    }
    return uResult;
}